

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cc
# Opt level: O3

string * __thiscall
flow::disassemble_abi_cxx11_
          (string *__return_storage_ptr__,flow *this,Instruction pc,size_t ip,size_t sp,
          ConstantPool *cp)

{
  int *__buf;
  int iVar1;
  long lVar2;
  bool bVar3;
  string *psVar4;
  ushort uVar5;
  uint uVar6;
  ulong *puVar7;
  size_t sVar8;
  ostream *poVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  undefined8 uVar14;
  uint uVar15;
  char *__buf_00;
  long *plVar16;
  int *piVar17;
  Cidr *this_00;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  string_view format_str_07;
  string_view format_str_08;
  string_view format_str_09;
  Operand A;
  string word;
  Operand B;
  Operand C;
  string __str;
  stringstream line;
  undefined6 in_stack_fffffffffffffb68;
  long *local_490;
  ulong local_488;
  long local_480 [2];
  ushort local_46c;
  unsigned_short local_46a;
  long *local_468;
  long *local_460;
  long *local_458;
  ulong uStack_450;
  long local_448 [2];
  ulong *local_438 [2];
  ulong local_428 [2];
  ulong local_418;
  ulong local_408;
  string local_3f8;
  undefined1 local_3d8 [504];
  long *local_1e0;
  string *local_1d8;
  flow *local_1d0;
  Instruction local_1c8;
  size_t local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  args;
  
  uVar5 = (ushort)((ulong)this >> 0x10);
  local_46c = (ushort)((ulong)this >> 0x20);
  local_46a = (unsigned_short)((ulong)this >> 0x30);
  uVar15 = (uint)this & 0xff;
  puVar7 = *(ulong **)(instructionInfos + (ulong)(uVar15 << 5) + 8);
  local_1d8 = __return_storage_ptr__;
  local_1d0 = this;
  local_1c8 = pc;
  local_1c0 = ip;
  std::__cxx11::stringstream::stringstream(local_1b8);
  args.values_ = (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)local_438;
  local_3f8._M_string_length = (size_type)local_3d8;
  local_3f8.field_2._M_allocated_capacity = 0;
  local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
  local_3f8.field_2._8_8_ = 500;
  format_str.size_ = 6;
  format_str.data_ = "{:<10}";
  args_00.field_1.values_ = args.values_;
  args_00.types_ = 10;
  local_438[0] = puVar7;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3f8,format_str,args_00);
  local_490 = local_480;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_490,local_3f8._M_string_length,
             (undefined1 *)(local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity));
  local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
  if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
    operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
  uVar10 = local_488;
  if (sp == 0) {
    iVar1 = *(int *)(instructionInfos + (ulong)(uVar15 << 5) + 0x10);
    if (iVar1 == 1) {
      local_458 = (long *)(ulong)uVar5;
      local_3f8.field_2._M_allocated_capacity = 0;
      local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
      local_3f8._M_string_length = (size_type)local_3d8;
      local_3f8.field_2._8_8_ = 500;
      format_str_02.size_ = 2;
      format_str_02.data_ = "{}";
      args_03.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_458;
      args_03.types_ = 3;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_3f8,format_str_02,args_03);
      local_438[0] = local_428;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,local_3f8._M_string_length,
                 (undefined1 *)
                 (local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity));
      local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
      if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
        operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
      }
      std::__cxx11::string::operator=((string *)&local_490,(string *)local_438);
      if (local_438[0] != local_428) {
        operator_delete(local_438[0],local_428[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    else if (iVar1 == 2) {
      local_438[0] = (ulong *)(ulong)uVar5;
      local_428[0] = (ulong)local_46c;
      local_3f8.field_2._M_allocated_capacity = 0;
      local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
      local_3f8._M_string_length = (size_type)local_3d8;
      local_3f8.field_2._8_8_ = 500;
      format_str_01.size_ = 6;
      format_str_01.data_ = "{}, {}";
      args_02.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_438;
      args_02.types_ = 0x33;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_3f8,format_str_01,args_02);
      local_458 = local_448;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_458,local_3f8._M_string_length,
                 (undefined1 *)
                 (local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity));
      local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
      if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
        operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
      }
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_458);
      if (local_458 != local_448) {
        operator_delete(local_458,local_448[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    else {
      if (iVar1 != 3) goto LAB_001658af;
      local_438[0] = (ulong *)(ulong)uVar5;
      local_428[0] = (ulong)local_46c;
      local_3f8.field_2._M_allocated_capacity = 0;
      local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
      local_3f8._M_string_length = (size_type)local_3d8;
      local_3f8.field_2._8_8_ = 500;
      format_str_00.size_ = 10;
      format_str_00.data_ = "{}, {}, {}";
      args_01.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_438;
      args_01.types_ = 0x333;
      local_418 = (ulong)this >> 0x30;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_3f8,format_str_00,args_01);
      local_458 = local_448;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_458,local_3f8._M_string_length,
                 (undefined1 *)
                 (local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity));
      local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
      if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
        operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
      }
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_458);
      if (local_458 != local_448) {
        operator_delete(local_458,local_448[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    goto LAB_001658a2;
  }
  if (0x2a < uVar15) {
    if (uVar15 < 0x41) {
      if (uVar15 == 0x2b) {
        puVar7 = (ulong *)(*(long *)(sp + 0x18) + (ulong)uVar5 * 0x20);
        local_458 = (long *)*puVar7;
        uStack_450 = puVar7[1];
        local_3f8.field_2._M_allocated_capacity = 0;
        local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
        local_3f8._M_string_length = (size_type)local_3d8;
        local_3f8.field_2._8_8_ = 500;
        format_str_05.size_ = 4;
        format_str_05.data_ = "\"{}\"";
        args_06.field_1.values_ =
             (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_458;
        args_06.types_ = 0xb;
        fmt::v5::
        vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ((range)&local_3f8,format_str_05,args_06);
        local_438[0] = local_428;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,local_3f8._M_string_length,
                   (undefined1 *)
                   (local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity));
        local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
        if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
          operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
        }
        std::__cxx11::string::operator=((string *)&local_490,(string *)local_438);
        if (local_438[0] != local_428) {
          operator_delete(local_438[0],local_428[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
      }
      else {
        if (uVar15 != 0x3d) goto switchD_00164978_caseD_11;
        lVar21 = (ulong)uVar5 * 0x40 + (ulong)uVar5 * 4;
        __buf_00 = (char *)(*(long *)(sp + 0x30) + lVar21 + 4);
        if (*__buf_00 == '\0') {
          piVar17 = (int *)(*(long *)(sp + 0x30) + lVar21);
          inet_ntop(*piVar17,(void *)((long)piVar17 + 0x32),__buf_00,0x2e);
        }
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        sVar8 = strlen(__buf_00);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,__buf_00,__buf_00 + sVar8);
        std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
      }
    }
    else if (uVar15 == 0x41) {
      util::Cidr::str_abi_cxx11_
                (&local_3f8,(Cidr *)((ulong)((uint)uVar5 * 0x50) + *(long *)(sp + 0x48)));
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    else if (uVar15 == 0x49) {
      std::__cxx11::string::_M_assign((string *)&local_490);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    else {
      if (uVar15 != 0x4a) goto switchD_00164978_caseD_11;
      std::__cxx11::string::_M_assign((string *)&local_490);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    goto LAB_001658a2;
  }
  switch(uVar15) {
  case 0xb:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    lVar20 = uVar10 + 1;
    uVar10 = (ulong)uVar5;
    lVar21 = *(long *)(sp + 0x78);
    lVar13 = *(long *)(lVar21 + 8 + uVar10 * 0x18) - *(long *)(lVar21 + uVar10 * 0x18);
    if (lVar13 != 0) {
      local_1e0 = (long *)(lVar13 >> 3);
      local_468 = (long *)(lVar21 + uVar10 * 0x18);
      plVar16 = (long *)0x0;
      do {
        local_460 = plVar16;
        if (plVar16 == (long *)0x0) {
          puVar7 = (ulong *)*local_468;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          lVar20 = lVar20 + 2;
          puVar7 = (ulong *)((long)plVar16 * 8 + *local_468);
        }
        uVar10 = *puVar7;
        uVar18 = -uVar10;
        if (0 < (long)uVar10) {
          uVar18 = uVar10;
        }
        uVar15 = 1;
        if (9 < uVar18) {
          uVar11 = uVar18;
          uVar6 = 4;
          do {
            uVar15 = uVar6;
            if (uVar11 < 100) {
              uVar15 = uVar15 - 2;
              goto LAB_00164a78;
            }
            if (uVar11 < 1000) {
              uVar15 = uVar15 - 1;
              goto LAB_00164a78;
            }
            if (uVar11 < 10000) goto LAB_00164a78;
            bVar3 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            uVar6 = uVar15 + 4;
          } while (bVar3);
          uVar15 = uVar15 + 1;
        }
LAB_00164a78:
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_3f8,(char)uVar15 - (char)((long)uVar10 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_3f8._M_dataplus._M_p + -((long)uVar10 >> 0x3f),uVar15,uVar18);
        std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
        lVar20 = lVar20 + local_488;
        plVar16 = (long *)((long)local_460 + 1);
      } while (plVar16 != local_1e0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
    break;
  case 0xc:
    local_3f8._M_dataplus._M_p._0_1_ = 0x5b;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_3f8,1);
    lVar20 = uVar10 + 1;
    uVar10 = (ulong)uVar5;
    lVar21 = *(long *)(sp + 0x90);
    lVar13 = *(long *)(lVar21 + 8 + uVar10 * 0x18) - *(long *)(lVar21 + uVar10 * 0x18);
    if (lVar13 != 0) {
      plVar16 = (long *)(lVar21 + uVar10 * 0x18);
      lVar21 = 8;
      lVar19 = 0;
      do {
        if (lVar19 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          lVar20 = lVar20 + 2;
        }
        local_3f8._M_dataplus._M_p._0_1_ = 0x22;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_3f8,1);
        lVar2 = *plVar16;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,*(char **)(lVar2 + -8 + lVar21),*(long *)(lVar2 + lVar21));
        local_3f8._M_dataplus._M_p._0_1_ = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_3f8,1);
        lVar20 = lVar20 + *(long *)(*plVar16 + lVar21) + 2;
        lVar19 = lVar19 + 1;
        lVar21 = lVar21 + 0x20;
      } while (lVar13 >> 5 != lVar19);
    }
    local_3f8._M_dataplus._M_p._0_1_ = 0x5d;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_3f8,1);
    break;
  case 0xd:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    lVar20 = uVar10 + 1;
    uVar10 = (ulong)uVar5;
    lVar21 = *(long *)(sp + 0xa8);
    lVar13 = *(long *)(lVar21 + 8 + uVar10 * 0x18) - *(long *)(lVar21 + uVar10 * 0x18);
    if (lVar13 != 0) {
      local_468 = (long *)((lVar13 >> 2) * -0xf0f0f0f0f0f0f0f);
      local_460 = (long *)(lVar21 + uVar10 * 0x18);
      lVar21 = 0;
      plVar16 = (long *)0x0;
      do {
        if (plVar16 == (long *)0x0) {
          piVar17 = (int *)*local_460;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          lVar20 = lVar20 + 2;
          piVar17 = (int *)(*local_460 + lVar21);
        }
        __buf = piVar17 + 1;
        if ((char)piVar17[1] == '\0') {
          inet_ntop(*piVar17,(void *)((long)piVar17 + 0x32),(char *)__buf,0x2e);
        }
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        sVar8 = strlen((char *)__buf);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,__buf,(char *)(sVar8 + (long)__buf));
        std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
        lVar20 = lVar20 + local_488;
        plVar16 = (long *)((long)plVar16 + 1);
        lVar21 = lVar21 + 0x44;
      } while (local_468 != plVar16);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
    break;
  case 0xe:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    lVar20 = uVar10 + 1;
    uVar10 = (ulong)uVar5;
    lVar21 = *(long *)(sp + 0xc0);
    lVar13 = *(long *)(lVar21 + 8 + uVar10 * 0x18) - *(long *)(lVar21 + uVar10 * 0x18);
    if (lVar13 != 0) {
      plVar16 = (long *)(lVar21 + uVar10 * 0x18);
      lVar21 = 0;
      lVar19 = 0;
      do {
        if (lVar19 == 0) {
          this_00 = (Cidr *)*plVar16;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          lVar20 = lVar20 + 2;
          this_00 = (Cidr *)(*plVar16 + lVar21);
        }
        util::Cidr::str_abi_cxx11_(&local_3f8,this_00);
        std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
        lVar20 = lVar20 + local_488;
        lVar19 = lVar19 + 1;
        lVar21 = lVar21 + 0x50;
      } while ((lVar13 >> 4) * -0x3333333333333333 - lVar19 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
    break;
  case 0xf:
    local_458 = (long *)(ulong)uVar5;
    local_3f8.field_2._M_allocated_capacity = 0;
    local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
    local_3f8._M_string_length = (size_type)local_3d8;
    local_3f8.field_2._8_8_ = 500;
    format_str_03.size_ = 9;
    format_str_03.data_ = "STACK[{}]";
    args_04.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_458;
    args_04.types_ = 3;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_3f8,format_str_03,args_04);
    local_438[0] = local_428;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438,local_3f8._M_string_length,
               (undefined1 *)(local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity))
    ;
    local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
    if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
      operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
    }
    std::__cxx11::string::operator=((string *)&local_490,(string *)local_438);
    if (local_438[0] != local_428) {
      operator_delete(local_438[0],local_428[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    goto LAB_001658a2;
  case 0x10:
    local_458 = (long *)(ulong)uVar5;
    local_3f8.field_2._M_allocated_capacity = 0;
    local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
    local_3f8._M_string_length = (size_type)local_3d8;
    local_3f8.field_2._8_8_ = 500;
    format_str_04.size_ = 10;
    format_str_04.data_ = "@STACK[{}]";
    args_05.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_458;
    args_05.types_ = 3;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_3f8,format_str_04,args_05);
    local_438[0] = local_428;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438,local_3f8._M_string_length,
               (undefined1 *)(local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity))
    ;
    local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
    if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
      operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
    }
    std::__cxx11::string::operator=((string *)&local_490,(string *)local_438);
    if (local_438[0] != local_428) {
      operator_delete(local_438[0],local_428[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    goto LAB_001658a2;
  default:
switchD_00164978_caseD_11:
    iVar1 = *(int *)(instructionInfos + (ulong)(uVar15 << 5) + 0x10);
    if (iVar1 == 1) {
      format_str_09.size_ = (size_t)&stack0xfffffffffffffb6e;
      format_str_09.data_ = (char *)0x2;
      fmt::v5::format<unsigned_short>
                (&local_3f8,(v5 *)0x18377f,format_str_09,(unsigned_short *)args.values_);
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    else if (iVar1 == 2) {
      format_str_08.size_ = (size_t)&stack0xfffffffffffffb6e;
      format_str_08.data_ = (char *)0x6;
      fmt::v5::format<unsigned_short,unsigned_short>
                (&local_3f8,(v5 *)0x18377b,format_str_08,&local_46c,(unsigned_short *)cp);
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    else {
      if (iVar1 != 3) goto LAB_001658af;
      format_str_07.size_ = (size_t)&stack0xfffffffffffffb6e;
      format_str_07.data_ = (char *)0xa;
      fmt::v5::format<unsigned_short,unsigned_short,unsigned_short>
                (&local_3f8,(v5 *)"{}, {}, {}",format_str_07,&local_46c,&local_46a,
                 (unsigned_short *)CONCAT26(uVar5,in_stack_fffffffffffffb68));
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
    }
    goto LAB_001658a2;
  case 0x12:
    uVar18 = *(ulong *)(*(long *)sp + (ulong)uVar5 * 8);
    uVar11 = -uVar18;
    if (0 < (long)uVar18) {
      uVar11 = uVar18;
    }
    uVar15 = 1;
    if (9 < uVar11) {
      uVar12 = uVar11;
      uVar6 = 4;
      do {
        uVar15 = uVar6;
        if (uVar12 < 100) {
          uVar15 = uVar15 - 2;
          goto LAB_00165826;
        }
        if (uVar12 < 1000) {
          uVar15 = uVar15 - 1;
          goto LAB_00165826;
        }
        if (uVar12 < 10000) goto LAB_00165826;
        bVar3 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        uVar6 = uVar15 + 4;
      } while (bVar3);
      uVar15 = uVar15 + 1;
    }
LAB_00165826:
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_3f8,(char)uVar15 - (char)((long)uVar18 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_3f8._M_dataplus._M_p + -((long)uVar18 >> 0x3f),uVar15,uVar11);
    std::__cxx11::string::operator=((string *)&local_490,(string *)&local_3f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
LAB_001658a2:
    uVar10 = uVar10 + local_488;
    goto LAB_001658af;
  }
  uVar10 = lVar20 + 1;
LAB_001658af:
  if (uVar10 < 0x23) {
    lVar21 = uVar10 - 0x23;
    do {
      local_3f8._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_3f8,1);
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0);
  }
  uVar6 = getStackChange((Instruction)local_1d0);
  uVar15 = -uVar6;
  if (0 < (int)uVar6) {
    uVar15 = uVar6;
  }
  local_408 = (ulong)uVar15;
  uVar14 = 0x2d;
  if (uVar6 == 0) {
    uVar14 = 0x20;
  }
  local_438[0] = (ulong *)local_1c8;
  local_418 = 0x2b;
  if ((int)uVar6 < 1) {
    local_418 = uVar14;
  }
  local_428[0] = local_1c0;
  local_3f8.field_2._M_allocated_capacity = 0;
  local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
  local_3f8._M_string_length = (size_type)local_3d8;
  local_3f8.field_2._8_8_ = 500;
  format_str_06.size_ = 0x1a;
  format_str_06.data_ = "; ip={:>3} sp={:>2} ({}{})";
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_438;
  args_07.types_ = 0x2755;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_3f8,format_str_06,args_07);
  local_458 = local_448;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_458,local_3f8._M_string_length,
             (undefined1 *)(local_3f8._M_string_length + local_3f8.field_2._M_allocated_capacity));
  local_3f8._M_dataplus._M_p = (pointer)&PTR_grow_001ade08;
  if ((undefined1 *)local_3f8._M_string_length != local_3d8) {
    operator_delete((void *)local_3f8._M_string_length,local_3f8.field_2._8_8_);
  }
  std::__cxx11::string::operator=((string *)&local_490,(string *)&local_458);
  if (local_458 != local_448) {
    operator_delete(local_458,local_448[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_490,local_488);
  psVar4 = local_1d8;
  std::__cxx11::stringbuf::str();
  if (local_490 != local_480) {
    operator_delete(local_490,local_480[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string disassemble(Instruction pc, size_t ip, size_t sp, const ConstantPool* cp) {
  const Opcode opc = opcode(pc);
  const Operand A = operandA(pc);
  const Operand B = operandB(pc);
  const Operand C = operandC(pc);
  const char* mnemo = mnemonic(opc);
  std::stringstream line;
  size_t n = 0;

  std::string word = fmt::format("{:<10}", mnemo);
  line << word;
  n += word.size();

  // operands
  if (cp != nullptr) {
    switch (opc) {
      case Opcode::ITLOAD: {
        line << "[";
        n++;
        const std::vector<FlowNumber>& v = cp->getIntArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          word = std::to_string(v[i]);
          line << word;
          n += word.size();
        }
        line << "]";
        n++;
        break;
      }
      case Opcode::STLOAD: {
        line << '[';
        n++;
        const std::vector<std::string>& v = cp->getStringArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          line << '"' << v[i] << '"';
          n += v[i].size() + 2;
        }
        line << ']';
        n += 1;
        break;
      }
      case Opcode::PTLOAD: {
        line << "[";
        n++;
        const std::vector<util::IPAddress>& v = cp->getIPAddressArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          word = v[i].str();
          line << word;
          n += word.size();
        }
        line << "]";
        n++;
        break;
      }
      case Opcode::CTLOAD: {
        line << "[";
        n++;
        const std::vector<util::Cidr>& v = cp->getCidrArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          word = v[i].str();
          line << word;
          n += word.size();
        }
        line << "]";
        n++;
        break;
      }
      case Opcode::LOAD:
        word = fmt::format("STACK[{}]", A);
        line << word;
        n += word.size();
        break;
      case Opcode::STORE:
        word = fmt::format("@STACK[{}]", A);
        line << word;
        n += word.size();
        break;
      case Opcode::NLOAD:
        word = std::to_string(cp->getInteger(A));
        line << word;
        n += word.size();
        break;
      case Opcode::SLOAD:
        word = fmt::format("\"{}\"", cp->getString(A));
        line << word;
        n += word.size();
        break;
      case Opcode::PLOAD:
        word = cp->getIPAddress(A).str();
        line << word;
        n += word.size();
        break;
      case Opcode::CLOAD:
        word = cp->getCidr(A).str();
        line << word;
        n += word.size();
        break;
      case Opcode::CALL:
        word = cp->getNativeFunctionSignatures()[A];
        line << word;
        n += word.size();
        break;
      case Opcode::HANDLER:
        word = cp->getNativeHandlerSignatures()[A];
        line << word;
        n += word.size();
        break;
      default:
        switch (operandSignature(opc)) {
          case OperandSig::III:
            word = fmt::format("{}, {}, {}", A, B, C);
            line << word;
            n += word.size();
            break;
          case OperandSig::II:
            word = fmt::format("{}, {}", A, B);
            line << word;
            n += word.size();
            break;
          case OperandSig::I:
            word = fmt::format("{}", A);
            line << word;
            n += word.size();
            break;
          case OperandSig::V:
            break;
        }
        break;
    }
  } else {
    switch (operandSignature(opc)) {
      case OperandSig::III:
        word = fmt::format("{}, {}, {}", A, B, C);
        line << word;
        n += word.size();
        break;
      case OperandSig::II:
        word = fmt::format("{}, {}", A, B);
        line << word;
        n += word.size();
        break;
      case OperandSig::I:
        word = fmt::format("{}", A);
        line << word;
        n += word.size();
        break;
      case OperandSig::V:
        break;
    }
  }

  while (n < 35) {
    line << ' ';
    n++;
  }

  int stackChange = getStackChange(pc);

  word = fmt::format("; ip={:>3} sp={:>2} ({}{})",
                     ip, sp,
                     stackChange > 0 ? '+' :
                         stackChange < 0 ? '-' : ' ',
                     std::abs(stackChange));
  line << word;

  return line.str();
}